

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shrink.cpp
# Opt level: O0

uint __thiscall
CaDiCaL::Internal::shrink_along_reason
          (Internal *this,int uip,int blevel,bool resolve_large_clauses,bool *failed_ptr,
          uint max_trail)

{
  int iVar1;
  Var *pVVar2;
  const_literal_iterator piVar3;
  const_literal_iterator piVar4;
  byte in_CL;
  int in_ESI;
  Internal *in_RDI;
  undefined1 *in_R8;
  int tmp;
  int lit;
  const_literal_iterator __end2;
  const_literal_iterator __begin2;
  Clause *__range2;
  Clause *c;
  Var *v;
  uint open;
  int in_stack_ffffffffffffff9c;
  Internal *this_00;
  Internal *this_01;
  uint local_28;
  
  local_28 = 0;
  pVVar2 = var(in_RDI,in_stack_ffffffffffffff9c);
  if (((in_CL & 1) == 0) && (pVVar2->reason->size != 2)) {
    *in_R8 = 1;
  }
  else {
    this_00 = (Internal *)pVVar2->reason;
    this_01 = this_00;
    piVar3 = Clause::begin((Clause *)this_00);
    piVar4 = Clause::end((Clause *)this_00);
    for (; piVar3 != piVar4; piVar3 = piVar3 + 1) {
      if (*piVar3 != in_ESI) {
        iVar1 = shrink_literal(this_01,(int)((ulong)this_00 >> 0x20),(int)this_00,
                               (uint)((ulong)piVar3 >> 0x20));
        if (iVar1 < 0) {
          *in_R8 = 1;
          return local_28;
        }
        if (0 < iVar1) {
          local_28 = local_28 + 1;
        }
      }
    }
  }
  return local_28;
}

Assistant:

unsigned inline Internal::shrink_along_reason (int uip, int blevel,
                                               bool resolve_large_clauses,
                                               bool &failed_ptr,
                                               unsigned max_trail) {
  LOG ("shrinking along the reason of lit %i", uip);
  unsigned open = 0;
#ifndef NDEBUG
  const Flags &f = flags (uip);
#endif
  const Var &v = var (uip);

  assert (f.shrinkable);
  assert (v.level == blevel);
  assert (v.reason);

  if (resolve_large_clauses || v.reason->size == 2) {
    const Clause &c = *v.reason;
    LOG (v.reason, "resolving with reason");
    for (int lit : c) {
      if (lit == uip)
        continue;
      assert (val (lit) < 0);
      int tmp = shrink_literal (lit, blevel, max_trail);
      if (tmp < 0) {
        failed_ptr = true;
        break;
      }
      if (tmp > 0) {
        ++open;
      }
    }
  } else {
    failed_ptr = true;
  }
  return open;
}